

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

int __thiscall IsoWriter::mkdir(IsoWriter *this,char *__path,__mode_t __mode)

{
  uint8_t objectId;
  FileEntryInfo *this_00;
  undefined4 in_register_00000014;
  FileEntryInfo *parent;
  allocator<char> local_41;
  string local_40 [32];
  
  if (this->m_rootDirInfo == (FileEntryInfo *)0x0) {
    this_00 = (FileEntryInfo *)0x0;
  }
  else {
    parent = this->m_rootDirInfo;
    if ((FileEntryInfo *)CONCAT44(in_register_00000014,__mode) != (FileEntryInfo *)0x0) {
      parent = (FileEntryInfo *)CONCAT44(in_register_00000014,__mode);
    }
    this_00 = (FileEntryInfo *)operator_new(0xa8);
    objectId = this->m_objectUniqId;
    this->m_objectUniqId = objectId + '\x01';
    FileEntryInfo::FileEntryInfo(this_00,this,parent,objectId,Directory);
    std::__cxx11::string::string<std::allocator<char>>(local_40,__path,&local_41);
    std::__cxx11::string::_M_assign((string *)&this_00->m_name);
    std::__cxx11::string::~string(local_40);
    FileEntryInfo::addSubDir(parent,this_00);
  }
  return (int)this_00;
}

Assistant:

FileEntryInfo *IsoWriter::mkdir(const char *name, FileEntryInfo *parent)
{
    if (!m_rootDirInfo)
        return nullptr;
    if (parent == nullptr)
        parent = m_rootDirInfo;

    const auto dir = new FileEntryInfo(this, parent, m_objectUniqId++, FileTypes::Directory);
    dir->setName(name);
    parent->addSubDir(dir);
    // m_sectorNum += 2;
    // m_systemStreamLBN = m_sectorNum; // last allocated sector
    return dir;
}